

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O1

void Kit_TruthSemiCanonicize_Yasha_simple(word *pInOut,int nVars,int *pStore)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (nVars < 0x11) {
    iVar3 = Kit_TruthCountOnes_64bit(pInOut,nVars);
    if (iVar3 != uVar1 * 0x20 && SBORROW4(iVar3,uVar1 * 0x20) == (int)(iVar3 + uVar1 * -0x20) < 0) {
      if (0 < (int)uVar1) {
        lVar5 = (ulong)uVar1 + 1;
        do {
          pInOut[lVar5 + -2] = ~pInOut[lVar5 + -2];
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
      iVar3 = uVar1 * 0x40 - iVar3;
    }
    Kit_TruthCountOnesInCofs_64bit(pInOut,nVars,pStore);
    if (0 < nVars) {
      uVar6 = 0;
      do {
        iVar4 = iVar3 - pStore[uVar6];
        if (pStore[uVar6] < iVar4) {
          pStore[uVar6] = iVar4;
          Kit_TruthChangePhase_64bit(pInOut,nVars,(int)uVar6);
        }
        uVar6 = uVar6 + 1;
      } while ((uint)nVars != uVar6);
    }
    if (1 < nVars) {
      do {
        uVar6 = 0;
        bVar2 = false;
        do {
          iVar3 = pStore[uVar6];
          if (pStore[uVar6 + 1] < iVar3) {
            pStore[uVar6] = pStore[uVar6 + 1];
            pStore[uVar6 + 1] = iVar3;
            Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,(int)uVar6);
            bVar2 = true;
          }
          uVar6 = uVar6 + 1;
        } while (nVars - 1 != uVar6);
      } while ((bVar2) && (1 < nVars));
    }
    return;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckySwap.c"
                ,0x16a,"void Kit_TruthSemiCanonicize_Yasha_simple(word *, int, int *)");
}

Assistant:

void  Kit_TruthSemiCanonicize_Yasha_simple( word* pInOut, int nVars, int * pStore )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, Temp, fChange, nOnes; 
    assert( nVars <= 16 );
    
    nOnes = Kit_TruthCountOnes_64bit(pInOut, nVars);
    
    if ( (nOnes > nWords * 32) )
    { 
        Kit_TruthNot_64bit( pInOut, nVars );
        nOnes = nWords*64 - nOnes;
    }
    
    // collect the minterm counts
    Kit_TruthCountOnesInCofs_64bit( pInOut, nVars, pStore );
    
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[i] >= nOnes-pStore[i])
            continue;        
        pStore[i] = nOnes-pStore[i]; 
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
    }  
    
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[i] <= pStore[i+1] )
                continue;            
            fChange = 1;            
            
            Temp = pStore[i];
            pStore[i] = pStore[i+1];
            pStore[i+1] = Temp;
            
            Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );            
        }
    } while ( fChange ); 
}